

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O0

btMatrix3x3 * operator*(btMatrix3x3 *m,btScalar *k)

{
  btVector3 *pbVar1;
  btScalar *pbVar2;
  float *in_RDX;
  btMatrix3x3 *in_RSI;
  btMatrix3x3 *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  btScalar *unaff_retaddr;
  btScalar *in_stack_00000008;
  btScalar *in_stack_00000010;
  btScalar *in_stack_00000018;
  
  pbVar1 = btMatrix3x3::operator[](in_RSI,0);
  pbVar2 = btVector3::x(pbVar1);
  fVar3 = *pbVar2 * *in_RDX;
  pbVar1 = btMatrix3x3::operator[](in_RSI,0);
  pbVar2 = btVector3::y(pbVar1);
  fVar4 = *pbVar2 * *in_RDX;
  pbVar1 = btMatrix3x3::operator[](in_RSI,0);
  pbVar2 = btVector3::z(pbVar1);
  fVar5 = *pbVar2 * *in_RDX;
  pbVar1 = btMatrix3x3::operator[](in_RSI,1);
  pbVar2 = btVector3::x(pbVar1);
  fVar6 = *pbVar2 * *in_RDX;
  pbVar1 = btMatrix3x3::operator[](in_RSI,1);
  pbVar2 = btVector3::y(pbVar1);
  fVar7 = *pbVar2 * *in_RDX;
  pbVar1 = btMatrix3x3::operator[](in_RSI,1);
  pbVar2 = btVector3::z(pbVar1);
  fVar8 = *pbVar2 * *in_RDX;
  pbVar1 = btMatrix3x3::operator[](in_RSI,2);
  pbVar2 = btVector3::x(pbVar1);
  fVar9 = *pbVar2 * *in_RDX;
  pbVar1 = btMatrix3x3::operator[](in_RSI,2);
  pbVar2 = btVector3::y(pbVar1);
  fVar10 = *pbVar2 * *in_RDX;
  pbVar1 = btMatrix3x3::operator[](in_RSI,2);
  btVector3::z(pbVar1);
  btMatrix3x3::btMatrix3x3
            (in_RSI,in_RDX,(btScalar *)CONCAT44(fVar3,fVar4),(btScalar *)CONCAT44(fVar5,fVar6),
             (btScalar *)CONCAT44(fVar7,fVar8),(btScalar *)CONCAT44(fVar9,fVar10),unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018);
  return in_RDI;
}

Assistant:

SIMD_FORCE_INLINE btMatrix3x3
operator*(const btMatrix3x3& m, const btScalar & k)
{
#if (defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE))
    __m128 vk = bt_splat_ps(_mm_load_ss((float *)&k), 0x80);
    return btMatrix3x3(
                _mm_mul_ps(m[0].mVec128, vk), 
                _mm_mul_ps(m[1].mVec128, vk), 
                _mm_mul_ps(m[2].mVec128, vk)); 
#elif defined(BT_USE_NEON)
    return btMatrix3x3(
                vmulq_n_f32(m[0].mVec128, k),
                vmulq_n_f32(m[1].mVec128, k),
                vmulq_n_f32(m[2].mVec128, k)); 
#else
	return btMatrix3x3(
		m[0].x()*k,m[0].y()*k,m[0].z()*k,
		m[1].x()*k,m[1].y()*k,m[1].z()*k,
		m[2].x()*k,m[2].y()*k,m[2].z()*k);
#endif
}